

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cayley.cpp
# Opt level: O0

cayley_t * opengv::math::rot2cayley(rotation_t *R)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  Scalar SVar3;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
  *in_RSI;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_RDI;
  Matrix3d C;
  Matrix3d C2;
  Matrix3d C1;
  cayley_t *cayley;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
  *other;
  Matrix<double,_3,_3,_0,_3,_3> *in_stack_fffffffffffffea0;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffffec0;
  
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x1279541);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x127954e);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x127955b);
  other = in_RSI;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator-(in_RDI,in_stack_fffffffffffffec0);
  Eigen::Matrix<double,3,3,0,3,3>::operator=(in_stack_fffffffffffffea0,other);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+(in_RDI,in_stack_fffffffffffffec0);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_RSI,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)other);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::inverse
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RSI,
             (MatrixBase<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)other);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_RSI,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
              *)other);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x127961d);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_RSI,
                      (Index)other,0x1279634);
  SVar3 = *pSVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_RSI,
                      (Index)other);
  *pSVar2 = -SVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_RSI,
                      (Index)other,0x1279683);
  SVar3 = *pSVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_RSI,
                      (Index)other);
  *pSVar2 = SVar3;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_RSI,
                      (Index)other,0x12796bc);
  SVar3 = -*pSVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_RSI,
                      (Index)other);
  *pSVar2 = SVar3;
  return (cayley_t *)in_RDI;
}

Assistant:

opengv::cayley_t
opengv::math::rot2cayley( const rotation_t & R )
{
  Eigen::Matrix3d C1;
  Eigen::Matrix3d C2;
  Eigen::Matrix3d C;
  C1 = R-Eigen::Matrix3d::Identity();
  C2 = R+Eigen::Matrix3d::Identity();
  C = C1 * C2.inverse();

  cayley_t cayley;
  cayley[0] = -C(1,2);
  cayley[1] = C(0,2);
  cayley[2] = -C(0,1);

  return cayley;
}